

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cxx17_string_view.cpp
# Opt level: O2

void __thiscall
iu_StringViewSplit_x_iutest_x_chain_at_last_front_by_c_str_Test<wchar_t>::Body
          (iu_StringViewSplit_x_iutest_x_chain_at_last_front_by_c_str_Test<wchar_t> *this)

{
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *in_R9;
  AssertionResult iutest_ar;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> re;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> s;
  AssertionResult local_208;
  iuCodeMessage local_1e0;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_1b0;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_1a0;
  Fixed local_190;
  
  local_1a0._M_len = 0x13;
  local_1a0._M_str = L"arikitari na_world!";
  local_190.super_Message.m_stream.super_iu_stringstream._0_8_ = L"_ ";
  local_1b0 = detail::
              operator|<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_const_wchar_t_*,_wchar_t,_nullptr>
                        (&local_1a0,
                         (split_helper_subroutine<detail::split_at_last_front,_const_wchar_t_*,_wchar_t>
                          *)&local_190);
  local_190.super_Message.m_stream.super_iu_stringstream._0_8_ = L"arikitari na";
  iutest::internal::
  CmpHelperEQ<wchar_t_const*,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
            (&local_208,(internal *)"constant::arikitari_na<char_type>()","re",(char *)&local_190,
             (wchar_t **)&local_1b0,in_R9);
  if (local_208.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
               ,0x9c,local_208.m_message._M_dataplus._M_p);
    local_1e0._44_4_ = 2;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_1e0,&local_190);
    std::__cxx11::string::~string((string *)&local_1e0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&local_208);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringViewSplit, chain_at_last_front_by_c_str)
{
	using char_type = TypeParam;
	const std::basic_string_view<char_type> s = constant::arikitari_na_world_underscore<char_type>();
	const auto re = s | split(constant::space_underscore<char_type>()) >> at_last().front();
	IUTEST_ASSERT_EQ(constant::arikitari_na<char_type>(), re);
}